

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O1

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
ContIntLoadConstraint_C
          (ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
           *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,double recovery_clamp)

{
  double dVar1;
  double dVar2;
  
  ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
  ContIntLoadConstraint_C
            (&this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>,
             off_L,Qc,c,do_clamp,recovery_clamp);
  dVar1 = ((((this->
             super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
             super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>.
            container)->super_ChPhysicsItem).system)->step;
  dVar2 = 1.0 / (dVar1 * (dVar1 + (this->
                                  super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                                  ).dampingf));
  dVar1 = dVar2 * (double)this->complianceRoll;
  (this->Ru).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.cfm_i = dVar1;
  (this->Rv).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.cfm_i = dVar1;
  (this->Rx).
  super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<6>_>
  .super_ChConstraint.cfm_i = dVar2 * (double)this->complianceSpin;
  return;
}

Assistant:

virtual void ContIntLoadConstraint_C(const unsigned int off_L,
                                         ChVectorDynamic<>& Qc,
                                         const double c,
                                         bool do_clamp,
                                         double recovery_clamp) override {
        // base behaviour too
        ChContactNSC<Ta, Tb>::ContIntLoadConstraint_C(off_L, Qc, c, do_clamp, recovery_clamp);

        // If rolling and spinning compliance, set the cfm terms
        double h = this->container->GetSystem()->GetStep();

        //***TODO*** move to KRMmatricesLoad() the following, and only for !bounced case
        double alpha = this->dampingf;              // [R]=alpha*[K]
        double inv_hhpa = 1.0 / (h * (h + alpha));  // 1/(h*(h+a))

        this->Ru.Set_cfm_i((inv_hhpa) * this->complianceRoll);
        this->Rv.Set_cfm_i((inv_hhpa) * this->complianceRoll);
        this->Rx.Set_cfm_i((inv_hhpa) * this->complianceSpin);
    }